

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall
cmRuntimeDependencyArchive::GetRuntimeDependencies
          (cmRuntimeDependencyArchive *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *executables,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libraries,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *modules)

{
  pointer pbVar1;
  cmBinUtilsLinker *pcVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  pointer pbVar6;
  pointer pbVar7;
  bool bVar8;
  
  pbVar6 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pbVar6 == pbVar1;
  if (!bVar8) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,0);
    cVar3 = (char)iVar4;
    while (cVar3 != '\0') {
      pbVar6 = pbVar6 + 1;
      bVar8 = pbVar6 == pbVar1;
      if (bVar8) goto LAB_006186e6;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,0);
      cVar3 = (char)iVar4;
    }
    if (!bVar8) {
      return false;
    }
  }
LAB_006186e6:
  pbVar6 = (libraries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (libraries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pbVar6 == pbVar1;
  if (!bVar8) {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,2);
    cVar3 = (char)iVar4;
    while (cVar3 != '\0') {
      pbVar6 = pbVar6 + 1;
      bVar8 = pbVar6 == pbVar1;
      if (bVar8) goto LAB_0061873c;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,2);
      cVar3 = (char)iVar4;
    }
    if (!bVar8) {
      return false;
    }
  }
LAB_0061873c:
  pbVar6 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (modules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)pbVar6 >> 7;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,3);
      pbVar7 = pbVar6;
      if ((char)iVar4 == '\0') goto LAB_00618844;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6 + 1,3);
      pbVar7 = pbVar6 + 1;
      if ((char)iVar4 == '\0') goto LAB_00618844;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6 + 2,3);
      pbVar7 = pbVar6 + 2;
      if ((char)iVar4 == '\0') goto LAB_00618844;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6 + 3,3);
      pbVar7 = pbVar6 + 3;
      if ((char)iVar4 == '\0') goto LAB_00618844;
      pbVar6 = pbVar6 + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar1 - (long)pbVar6 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar7 = pbVar1;
      if ((lVar5 != 3) ||
         (pcVar2 = (this->Linker)._M_t.
                   super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>
                   .super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl,
         iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,3), pbVar7 = pbVar6,
         (char)iVar4 == '\0')) goto LAB_00618844;
      pbVar6 = pbVar6 + 1;
    }
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,3);
    pbVar7 = pbVar6;
    if ((char)iVar4 == '\0') goto LAB_00618844;
    pbVar6 = pbVar6 + 1;
  }
  pcVar2 = (this->Linker)._M_t.
           super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
           super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
  iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar6,3);
  pbVar7 = pbVar6;
  if ((char)iVar4 != '\0') {
    pbVar7 = pbVar1;
  }
LAB_00618844:
  return pbVar7 == pbVar1;
}

Assistant:

bool cmRuntimeDependencyArchive::GetRuntimeDependencies(
  const std::vector<std::string>& executables,
  const std::vector<std::string>& libraries,
  const std::vector<std::string>& modules)
{
  for (auto const& exe : executables) {
    if (!this->Linker->ScanDependencies(exe, cmStateEnums::EXECUTABLE)) {
      return false;
    }
  }
  for (auto const& lib : libraries) {
    if (!this->Linker->ScanDependencies(lib, cmStateEnums::SHARED_LIBRARY)) {
      return false;
    }
  }
  return std::all_of(
    modules.begin(), modules.end(), [this](std::string const& mod) -> bool {
      return this->Linker->ScanDependencies(mod, cmStateEnums::MODULE_LIBRARY);
    });
}